

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

void Abc_NodeMffcLabel_rec(Abc_Obj_t *pNode,int fTopmost,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vNodes_local;
  int fTopmost_local;
  Abc_Obj_t *pNode_local;
  
  if (((fTopmost != 0) ||
      ((iVar1 = Abc_ObjIsCi(pNode), iVar1 == 0 && ((pNode->vFanouts).nSize < 1)))) &&
     (iVar1 = Abc_NodeIsTravIdCurrent(pNode), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pNode);
    for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_2c < iVar1; local_2c = local_2c + 1) {
      pNode_00 = Abc_ObjFanin(pNode,local_2c);
      Abc_NodeMffcLabel_rec(pNode_00,0,vNodes);
    }
    if (vNodes != (Vec_Ptr_t *)0x0) {
      Vec_PtrPush(vNodes,pNode);
    }
  }
  return;
}

Assistant:

void Abc_NodeMffcLabel_rec( Abc_Obj_t * pNode, int fTopmost, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
        return;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcLabel_rec( pFanin, 0, vNodes );
    // collect the internal node
//    printf( "%d ", pNode->Id );
    if ( vNodes )
        Vec_PtrPush( vNodes, pNode );
}